

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::bitcast_expression
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *target_type,
          BaseType expr_type,string *expr)

{
  char (*in_R9) [2];
  SPIRType src_type;
  spirv_cross local_1a0 [32];
  SPIRType local_180;
  
  if (*(BaseType *)&(target_type->super_IVariant).field_0xc == expr_type) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)expr);
  }
  else {
    SPIRType::SPIRType(&local_180,target_type);
    local_180.super_IVariant._12_4_ = expr_type;
    (*(this->super_Compiler)._vptr_Compiler[0x38])(local_1a0,this,target_type,&local_180);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[2]>
              (__return_storage_ptr__,local_1a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3965df,
               (char (*) [2])expr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37f234,in_R9);
    ::std::__cxx11::string::~string((string *)local_1a0);
    SPIRType::~SPIRType(&local_180);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerGLSL::bitcast_expression(const SPIRType &target_type, SPIRType::BaseType expr_type,
                                             const std::string &expr)
{
	if (target_type.basetype == expr_type)
		return expr;

	auto src_type = target_type;
	src_type.basetype = expr_type;
	return join(bitcast_glsl_op(target_type, src_type), "(", expr, ")");
}